

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

void chaiscript::dispatch::detail::
     call_func<void(*)(std::__cxx11::list<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>&,int,chaiscript::Boxed_Value_const&),void,std::__cxx11::list<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>&,int,chaiscript::Boxed_Value_const&,0ul,1ul,2ul>
               (_func_void_list<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_ptr_int_Boxed_Value_ptr
                **param_1,Function_Params *param_2,Function_Params *param_3,
               Type_Conversions_State *param_4)

{
  Boxed_Value *pBVar1;
  int iVar2;
  Boxed_Value *pBVar3;
  list<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *plVar4;
  Boxed_Value local_40;
  Type_Conversions_State *local_30;
  Type_Conversions_State *t_conversions_local;
  Function_Params *params_local;
  _func_void_list<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_ptr_int_Boxed_Value_ptr
  **f_local;
  _func_void_list<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_ptr_int_Boxed_Value_ptr
  *param_0_local;
  
  pBVar1 = param_2->m_begin;
  local_30 = param_4;
  t_conversions_local = (Type_Conversions_State *)param_3;
  params_local = param_2;
  f_local = param_1;
  pBVar3 = Function_Params::operator[](param_3,0);
  plVar4 = boxed_cast<std::__cxx11::list<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>&>
                     (pBVar3,local_30);
  pBVar3 = Function_Params::operator[]((Function_Params *)t_conversions_local,1);
  iVar2 = boxed_cast<int>(pBVar3,local_30);
  pBVar3 = Function_Params::operator[]((Function_Params *)t_conversions_local,2);
  boxed_cast<chaiscript::Boxed_Value_const&>((chaiscript *)&local_40,pBVar3,local_30);
  (*(code *)pBVar1)(plVar4,iVar2,(chaiscript *)&local_40);
  Boxed_Value::~Boxed_Value(&local_40);
  return;
}

Assistant:

Ret call_func(Ret (*)(Params...),
                    std::index_sequence<I...>,
                    const Callable &f,
                    [[maybe_unused]] const chaiscript::Function_Params &params,
                    [[maybe_unused]] const Type_Conversions_State &t_conversions) {
        return f(boxed_cast<Params>(params[I], &t_conversions)...);
      }